

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

QWidget * QApplication::activeModalWidget(void)

{
  long lVar1;
  QWidget *pQVar2;
  
  QGuiApplication::modalWindow();
  lVar1 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
  if (((lVar1 == 0) || (*(long *)(lVar1 + 0x28) == 0)) ||
     (*(int *)(*(long *)(lVar1 + 0x28) + 4) == 0)) {
    pQVar2 = (QWidget *)0x0;
  }
  else {
    pQVar2 = *(QWidget **)(lVar1 + 0x30);
  }
  return pQVar2;
}

Assistant:

QWidget *QApplication::activeModalWidget()
{
    QWidgetWindow *widgetWindow = qobject_cast<QWidgetWindow *>(modalWindow());
    return widgetWindow ? widgetWindow->widget() : nullptr;
}